

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkFlow.c
# Opt level: O0

int Nwk_ManPushBackwardTop_rec(Nwk_Obj_t *pObj,Nwk_Obj_t *pPred)

{
  int iVar1;
  Nwk_Obj_t *pNVar2;
  bool bVar3;
  int local_2c;
  Nwk_Obj_t *pNStack_28;
  int i;
  Nwk_Obj_t *pNext;
  Nwk_Obj_t *pPred_local;
  Nwk_Obj_t *pObj_local;
  
  iVar1 = Nwk_ObjVisitedTop(pObj);
  if (iVar1 == 0) {
    Nwk_ObjSetVisitedTop(pObj);
    iVar1 = Nwk_ObjIsSink(pObj);
    if (iVar1 == 0) {
      local_2c = 0;
      while( true ) {
        bVar3 = false;
        if (local_2c < pObj->nFanins) {
          pNStack_28 = pObj->pFanio[local_2c];
          bVar3 = pNStack_28 != (Nwk_Obj_t *)0x0;
        }
        if (!bVar3) {
          local_2c = 0;
          while( true ) {
            bVar3 = false;
            if (local_2c < pObj->nFanouts) {
              pNStack_28 = pObj->pFanio[pObj->nFanins + local_2c];
              bVar3 = pNStack_28 != (Nwk_Obj_t *)0x0;
            }
            if (!bVar3) break;
            iVar1 = Nwk_ObjIsCo(pObj);
            if ((iVar1 == 0) && (iVar1 = Nwk_ManPushBackwardTop_rec(pNStack_28,pPred), iVar1 != 0))
            {
              return 1;
            }
            local_2c = local_2c + 1;
          }
          iVar1 = Nwk_ObjHasFlow(pObj);
          if ((iVar1 != 0) && (pNVar2 = Nwk_ObjPred(pObj), pNVar2 != (Nwk_Obj_t *)0x0)) {
            pNVar2 = Nwk_ObjPred(pObj);
            iVar1 = Nwk_ManPushBackwardBot_rec(pObj,pNVar2);
            if (iVar1 != 0) {
              Nwk_ObjClearFlow(pObj);
              iVar1 = Nwk_ObjSetPred(pObj,(Nwk_Obj_t *)0x0);
              return iVar1;
            }
          }
          return 0;
        }
        iVar1 = Nwk_ManPushBackwardBot_rec(pNStack_28,pPred);
        if (iVar1 != 0) break;
        local_2c = local_2c + 1;
      }
      pObj_local._4_4_ = 1;
    }
    else {
      pObj_local._4_4_ = 1;
    }
  }
  else {
    pObj_local._4_4_ = 0;
  }
  return pObj_local._4_4_;
}

Assistant:

int Nwk_ManPushBackwardTop_rec( Nwk_Obj_t * pObj, Nwk_Obj_t * pPred )
{
    Nwk_Obj_t * pNext;
    int i;
    if ( Nwk_ObjVisitedTop(pObj) )
        return 0;
    Nwk_ObjSetVisitedTop(pObj);
    // check if this is the sink
    if ( Nwk_ObjIsSink(pObj) )
        return 1;
    // try to push through the fanins
    Nwk_ObjForEachFanin( pObj, pNext, i )
        if ( Nwk_ManPushBackwardBot_rec( pNext, pPred ) )
            return 1;
    // try to push through the fanouts
    Nwk_ObjForEachFanout( pObj, pNext, i )
        if ( !Nwk_ObjIsCo(pObj) && Nwk_ManPushBackwardTop_rec( pNext, pPred ) )
            return 1;
    // redirect the flow
    if ( Nwk_ObjHasFlow(pObj) )
        if ( Nwk_ObjPred(pObj) && Nwk_ManPushBackwardBot_rec( pObj, Nwk_ObjPred(pObj) ) )
        {
            Nwk_ObjClearFlow( pObj );
            return Nwk_ObjSetPred( pObj, NULL );
        }
    return 0;
}